

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O0

int Abc_NtkRetimeMinAreaInitValues_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsBo(pObj);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                      ,0x117,"int Abc_NtkRetimeMinAreaInitValues_rec(Abc_Obj_t *)");
      }
      for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
        pAVar2 = Abc_ObjFanin(pObj,local_24);
        Abc_NtkRetimeMinAreaInitValues_rec(pAVar2);
      }
      iVar1 = Abc_ObjSopSimulate(pObj);
      pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar1;
      pObj_local._4_4_ = (pObj->field_6).iTemp;
    }
    else {
      pAVar2 = Abc_ObjFanin0(pObj);
      iVar1 = Abc_ObjIsLatch(pAVar2);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsLatch(Abc_ObjFanin0(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/ret/retArea.c"
                      ,0x113,"int Abc_NtkRetimeMinAreaInitValues_rec(Abc_Obj_t *)");
      }
      pAVar2 = Abc_ObjFanin0(pObj);
      iVar1 = Abc_NtkRetimeMinAreaInitValues_rec(pAVar2);
      pObj->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)iVar1;
      pObj_local._4_4_ = (pObj->field_6).iTemp;
    }
  }
  else {
    pObj_local._4_4_ = (pObj->field_6).iTemp;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_NtkRetimeMinAreaInitValues_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return (int)(ABC_PTRUINT_T)pObj->pCopy;
    Abc_NodeSetTravIdCurrent(pObj);
    // consider the case of a latch output
    if ( Abc_ObjIsBo(pObj) )
    {
        assert( Abc_ObjIsLatch(Abc_ObjFanin0(pObj)) );
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_NtkRetimeMinAreaInitValues_rec( Abc_ObjFanin0(pObj) );
        return (int)(ABC_PTRUINT_T)pObj->pCopy;
    }
    assert( Abc_ObjIsNode(pObj) );
    // visit the fanins
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkRetimeMinAreaInitValues_rec( pFanin );
    // compute the value of the node
    pObj->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)Abc_ObjSopSimulate(pObj);
    return (int)(ABC_PTRUINT_T)pObj->pCopy;
}